

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrAtomic<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  short sVar5;
  unsigned_short uVar6;
  uint uVar7;
  uint32 byteLength_00;
  int iVar8;
  uint uVar9;
  undefined4 *puVar10;
  uint64 index_00;
  WebAssemblyMemory *this_00;
  ArrayBufferBase *pAVar11;
  undefined4 extraout_var;
  long *buffer_01;
  long bValue;
  char *pcVar12;
  uchar *puVar13;
  short *psVar14;
  unsigned_short *puVar15;
  int *piVar16;
  uint *puVar17;
  uint32 value_12;
  uint32 *readBuffer_12;
  int32 value_11;
  int32 *readBuffer_11;
  uint16 value_10;
  uint16 *readBuffer_10;
  int16 value_9;
  int16 *readBuffer_9;
  uint8 value_8;
  uint8 *readBuffer_8;
  int8 value_7;
  int8 *readBuffer_7;
  int64 value_6;
  int64 *readBuffer_6;
  uint32 value_5;
  uint32 *readBuffer_5;
  int32 value_4;
  int32 *readBuffer_4;
  uint16 value_3;
  uint16 *readBuffer_3;
  int16 value_2;
  int16 *readBuffer_2;
  uint8 value_1;
  uint8 *readBuffer_1;
  int8 value;
  int8 *readBuffer;
  BYTE *buffer;
  uint32 byteLength;
  ArrayBufferBase *arr;
  uint64 index;
  OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  byte *buffer_00;
  
  bVar2 = Wasm::Threads::IsEnabled();
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2356,"(Wasm::Threads::IsEnabled())","Wasm::Threads::IsEnabled()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2357,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  uVar9 = playout->Offset;
  uVar7 = GetRegRawInt<unsigned_int>(this,playout->SlotIndex);
  index_00 = (ulong)uVar9 + (ulong)uVar7;
  this_00 = GetWebAssemblyMemory(this);
  pAVar11 = WebAssemblyMemory::GetBuffer(this_00);
  byteLength_00 =
       (*(pAVar11->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  iVar8 = (*(pAVar11->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
  buffer_00 = (byte *)CONCAT44(extraout_var,iVar8);
  switch(playout->ViewType) {
  case TYPE_INT8:
    pcVar12 = WasmAtomicsArrayBoundsCheck<char>(this,buffer_00,index_00,byteLength_00);
    cVar3 = AtomicsOperations::Load<char>(pcVar12);
    SetRegRaw<int>(this,playout->Value,(int)cVar3);
    break;
  case TYPE_UINT8:
    puVar13 = WasmAtomicsArrayBoundsCheck<unsigned_char>(this,buffer_00,index_00,byteLength_00);
    bVar4 = AtomicsOperations::Load<unsigned_char>(puVar13);
    SetRegRaw<int>(this,playout->Value,(uint)bVar4);
    break;
  case TYPE_INT16:
    psVar14 = WasmAtomicsArrayBoundsCheck<short>(this,buffer_00,index_00,byteLength_00);
    sVar5 = AtomicsOperations::Load<short>(psVar14);
    SetRegRaw<int>(this,playout->Value,(int)sVar5);
    break;
  case TYPE_UINT16:
    puVar15 = WasmAtomicsArrayBoundsCheck<unsigned_short>(this,buffer_00,index_00,byteLength_00);
    uVar6 = AtomicsOperations::Load<unsigned_short>(puVar15);
    SetRegRaw<int>(this,playout->Value,(uint)uVar6);
    break;
  case TYPE_INT32:
    piVar16 = WasmAtomicsArrayBoundsCheck<int>(this,buffer_00,index_00,byteLength_00);
    iVar8 = AtomicsOperations::Load<int>(piVar16);
    SetRegRaw<int>(this,playout->Value,iVar8);
    break;
  case TYPE_UINT32:
    puVar17 = WasmAtomicsArrayBoundsCheck<unsigned_int>(this,buffer_00,index_00,byteLength_00);
    uVar9 = AtomicsOperations::Load<unsigned_int>(puVar17);
    SetRegRaw<int>(this,playout->Value,uVar9);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2367,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
    break;
  case TYPE_INT64:
    buffer_01 = WasmAtomicsArrayBoundsCheck<long>(this,buffer_00,index_00,byteLength_00);
    bValue = AtomicsOperations::Load<long>(buffer_01);
    SetRegRaw<long>(this,playout->Value,bValue);
    break;
  case TYPE_INT8_TO_INT64:
    pcVar12 = WasmAtomicsArrayBoundsCheck<char>(this,buffer_00,index_00,byteLength_00);
    cVar3 = AtomicsOperations::Load<char>(pcVar12);
    SetRegRaw<long>(this,playout->Value,(long)cVar3);
    break;
  case TYPE_UINT8_TO_INT64:
    puVar13 = WasmAtomicsArrayBoundsCheck<unsigned_char>(this,buffer_00,index_00,byteLength_00);
    bVar4 = AtomicsOperations::Load<unsigned_char>(puVar13);
    SetRegRaw<long>(this,playout->Value,(ulong)bVar4);
    break;
  case TYPE_INT16_TO_INT64:
    psVar14 = WasmAtomicsArrayBoundsCheck<short>(this,buffer_00,index_00,byteLength_00);
    sVar5 = AtomicsOperations::Load<short>(psVar14);
    SetRegRaw<long>(this,playout->Value,(long)sVar5);
    break;
  case TYPE_UINT16_TO_INT64:
    puVar15 = WasmAtomicsArrayBoundsCheck<unsigned_short>(this,buffer_00,index_00,byteLength_00);
    uVar6 = AtomicsOperations::Load<unsigned_short>(puVar15);
    SetRegRaw<long>(this,playout->Value,(ulong)uVar6);
    break;
  case TYPE_INT32_TO_INT64:
    piVar16 = WasmAtomicsArrayBoundsCheck<int>(this,buffer_00,index_00,byteLength_00);
    iVar8 = AtomicsOperations::Load<int>(piVar16);
    SetRegRaw<long>(this,playout->Value,(long)iVar8);
    break;
  case TYPE_UINT32_TO_INT64:
    puVar17 = WasmAtomicsArrayBoundsCheck<unsigned_int>(this,buffer_00,index_00,byteLength_00);
    uVar9 = AtomicsOperations::Load<unsigned_int>(puVar17);
    SetRegRaw<long>(this,playout->Value,(ulong)uVar9);
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdArrAtomic(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(Wasm::Threads::IsEnabled());
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW_INT(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: {\
            MemType* readBuffer = WasmAtomicsArrayBoundsCheck<MemType>(buffer, index, byteLength); \
            MemType value = AtomicsOperations::Load<MemType>(readBuffer); \
            SetRegRaw<RegType>(playout->Value, (RegType)value); \
            return; \
        }
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
#else
        Assert(UNREACHED);
#endif
    }